

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_pos.c
# Opt level: O3

mpt_node * mpt_gnode_pos(mpt_node *node,int pos)

{
  mpt_node *pmVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  
  if (node == (mpt_node *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    node = (mpt_node *)0x0;
  }
  else if (pos < 0) {
    iVar3 = pos + 1;
    do {
      node = node->prev;
      if (iVar3 == 0) {
        return node;
      }
      iVar3 = iVar3 + 1;
    } while (node != (mpt_node *)0x0);
  }
  else {
    pmVar1 = node;
    if (pos == 0) {
      do {
        node = pmVar1;
        pmVar1 = node->next;
      } while (node->next != (mpt_node *)0x0);
    }
    else if (pos != 1) {
      iVar3 = pos + -2;
      do {
        node = node->next;
        bVar4 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar4) {
          return node;
        }
      } while (node != (mpt_node *)0x0);
    }
  }
  return node;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_pos(const MPT_STRUCT(node) *node, int pos)
{
	if (!node) {
		errno = EFAULT;
		return 0;
	}
	/* get nth predecessor of node */
	if (pos < 0) {
		while (pos++ && node) {
			node = node->prev;
		}
	}
	/* get nth position starting with node */
	else if (pos) {
		while (--pos && node) {
			node = node->next;
		}
	}
	/* pos == 0 -> get last node */
	else {
		while (node->next) {
			node = node->next;
		}
	}
	
	return (MPT_STRUCT(node) *) node;
}